

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDScanner::scanMarkupDecl(DTDScanner *this,bool parseTextDecl)

{
  bool bVar1;
  XMLCh XVar2;
  ValSchemes VVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLValidator *pXVar6;
  XMLSize_t orgReader_1;
  XMLSize_t orgReader;
  XMLCh nextCh;
  bool parseTextDecl_local;
  DTDScanner *this_local;
  
  XVar2 = ReaderMgr::getNextChar(this->fReaderMgr);
  if (XVar2 == L'!') {
    bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'-');
    if (bVar1) {
      bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'-');
      if (bVar1) {
        scanComment(this);
      }
      else {
        XMLScanner::emitError(this->fScanner,CommentsMustStartWith);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
    }
    else {
      bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'[');
      if (bVar1) {
        if ((this->fInternalSubset & 1U) == 0) {
          checkForPERef(this,false,true);
          bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgIncludeString);
          if (bVar1) {
            checkForPERef(this,false,true);
            bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'[');
            if (!bVar1) {
              XMLScanner::emitError(this->fScanner,ExpectedINCLUDEBracket);
            }
            XVar4 = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
            checkForPERef(this,false,true);
            scanExtSubsetDecl(this,true,false);
            XVar5 = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
            if ((XVar5 != XVar4) &&
               (VVar3 = XMLScanner::getValidationScheme(this->fScanner), VVar3 == Val_Always)) {
              pXVar6 = XMLScanner::getValidator(this->fScanner);
              XMLValidator::emitError(pXVar6,PartialMarkupInPE);
            }
          }
          else {
            bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgIgnoreString);
            if (bVar1) {
              checkForPERef(this,false,true);
              bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'[');
              if (!bVar1) {
                XMLScanner::emitError(this->fScanner,ExpectedINCLUDEBracket);
              }
              XVar4 = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
              scanIgnoredSection(this);
              XVar5 = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
              if ((XVar5 != XVar4) &&
                 (VVar3 = XMLScanner::getValidationScheme(this->fScanner), VVar3 == Val_Always)) {
                pXVar6 = XMLScanner::getValidator(this->fScanner);
                XMLValidator::emitError(pXVar6,PartialMarkupInPE);
              }
            }
            else {
              XMLScanner::emitError(this->fScanner,ExpectedIncOrIgn);
              ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
            }
          }
        }
        else {
          XMLScanner::emitError(this->fScanner,ConditionalSectInIntSubset);
          ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
        }
      }
      else {
        bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgAttListString);
        if (bVar1) {
          scanAttListDecl(this);
        }
        else {
          bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgElemString);
          if (bVar1) {
            scanElementDecl(this);
          }
          else {
            bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgEntityString);
            if (bVar1) {
              scanEntityDecl(this);
            }
            else {
              bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNotationString);
              if (bVar1) {
                scanNotationDecl(this);
              }
              else {
                XMLScanner::emitError(this->fScanner,ExpectedMarkupDecl);
                ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
              }
            }
          }
        }
      }
    }
  }
  else if (XVar2 == L'?') {
    bVar1 = XMLScanner::checkXMLDecl(this->fScanner,false);
    if (bVar1) {
      if (parseTextDecl) {
        scanTextDecl(this);
      }
      else {
        XMLScanner::emitError(this->fScanner,TextDeclNotLegalHere);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
    }
    else {
      scanPI(this);
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedMarkupDecl);
    ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
  }
  return;
}

Assistant:

void DTDScanner::scanMarkupDecl(const bool parseTextDecl)
{
    //
    //  We only have two valid first characters here. One is a ! which opens
    //  some markup decl. The other is a ?, which could begin either a PI
    //  or a text decl. If parseTextDecl is false, we cannot accept a text
    //  decl.
    //
    const XMLCh nextCh = fReaderMgr->getNextChar();

    if (nextCh == chBang)
    {
        if (fReaderMgr->skippedChar(chDash))
        {
            if (fReaderMgr->skippedChar(chDash))
            {
                scanComment();
            }
             else
            {
                fScanner->emitError(XMLErrs::CommentsMustStartWith);
                fReaderMgr->skipPastChar(chCloseAngle);
            }
        }
         else if (fReaderMgr->skippedChar(chOpenSquare))
        {
            //
            //  Its a conditional section. This is only valid in the external
            //  subset, so issue an error if we aren't there.
            //
            if (fInternalSubset)
            {
                fScanner->emitError(XMLErrs::ConditionalSectInIntSubset);
                fReaderMgr->skipPastChar(chCloseAngle);
                return;
            }

            // A PE ref can happen here, but space is not required
            checkForPERef(false, true);

            if (fReaderMgr->skippedString(XMLUni::fgIncludeString))
            {
                checkForPERef(false, true);

                // Check for the following open square bracket
                if (!fReaderMgr->skippedChar(chOpenSquare))
                    fScanner->emitError(XMLErrs::ExpectedINCLUDEBracket);

                // Get the reader we started this on
                const XMLSize_t orgReader = fReaderMgr->getCurrentReaderNum();

                checkForPERef(false, true);

                //
                //  Recurse back to the ext subset call again, telling it its
                //  in an include section.
                //
                scanExtSubsetDecl(true, false);

                //
                //  And see if we got back to the same level. If not, then its
                //  a partial markup error.
                //
                if (fReaderMgr->getCurrentReaderNum() != orgReader && fScanner->getValidationScheme() == XMLScanner::Val_Always)
                    fScanner->getValidator()->emitError(XMLValid::PartialMarkupInPE);

            }
             else if (fReaderMgr->skippedString(XMLUni::fgIgnoreString))
            {
                checkForPERef(false, true);

                // Check for the following open square bracket
                if (!fReaderMgr->skippedChar(chOpenSquare))
                    fScanner->emitError(XMLErrs::ExpectedINCLUDEBracket);

                // Get the reader we started this on
                const XMLSize_t orgReader = fReaderMgr->getCurrentReaderNum();

                // And scan over the ignored part
                scanIgnoredSection();

                //
                //  And see if we got back to the same level. If not, then its
                //  a partial markup error.
                //
                if (fReaderMgr->getCurrentReaderNum() != orgReader && fScanner->getValidationScheme() == XMLScanner::Val_Always)
                    fScanner->getValidator()->emitError(XMLValid::PartialMarkupInPE);

            }
             else
            {
                fScanner->emitError(XMLErrs::ExpectedIncOrIgn);
                fReaderMgr->skipPastChar(chCloseAngle);
            }
        }
         else if (fReaderMgr->skippedString(XMLUni::fgAttListString))
        {
            scanAttListDecl();
        }
         else if (fReaderMgr->skippedString(XMLUni::fgElemString))
        {
            scanElementDecl();
        }
         else if (fReaderMgr->skippedString(XMLUni::fgEntityString))
        {
            scanEntityDecl();
        }
         else if (fReaderMgr->skippedString(XMLUni::fgNotationString))
        {
            scanNotationDecl();
        }
         else
        {
            fScanner->emitError(XMLErrs::ExpectedMarkupDecl);
            fReaderMgr->skipPastChar(chCloseAngle);
        }
    }
     else if (nextCh == chQuestion)
    {
        // It could be a PI or the XML declaration. Check for Decl
        if (fScanner->checkXMLDecl(false))
        {
            // If we are not accepting text decls, its an error
            if (parseTextDecl)
            {
                scanTextDecl();
            }
             else
            {
                // Emit the error and skip past this markup
                fScanner->emitError(XMLErrs::TextDeclNotLegalHere);
                fReaderMgr->skipPastChar(chCloseAngle);
            }
        }
         else
        {
            // It has to be a PI
            scanPI();
        }
    }
     else
    {
        // Can't be valid so emit error and try to skip past end of this decl
        fScanner->emitError(XMLErrs::ExpectedMarkupDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }
}